

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tok.c
# Opt level: O0

tokdfdef * tok_find_define(tokcxdef *ctx,char *sym,int len)

{
  int iVar1;
  errcxdef *ctx_00;
  char *facility;
  size_t sVar2;
  int in_EDX;
  long *in_RSI;
  long in_RDI;
  ulong l;
  size_t len_1;
  tokdfdef *df;
  int hsh;
  char *in_stack_ffffffffffffffc8;
  errcxdef *in_stack_ffffffffffffffd0;
  tokdfdef *local_28;
  
  iVar1 = tokdfhsh((char *)in_RSI,in_EDX);
  local_28 = *(tokdfdef **)(in_RDI + 0x2b0 + (long)iVar1 * 8);
  while( true ) {
    if (local_28 == (tokdfdef *)0x0) {
      return (tokdfdef *)0x0;
    }
    if ((local_28->len == in_EDX) && (iVar1 = memcmp(local_28->nm,in_RSI,(long)in_EDX), iVar1 == 0))
    break;
    local_28 = local_28->nxt;
  }
  if (in_EDX == 8) {
    if (*in_RSI == 0x5f5f454c49465f5f) {
      local_28->expan[0] = '\'';
      (**(code **)(*(long *)(in_RDI + 0x18) + 0x70))
                (*(undefined8 *)(in_RDI + 0x18),&local_28->field_0x19);
      ctx_00 = (errcxdef *)strlen(local_28->expan);
      local_28->expan[(long)ctx_00] = '\'';
      local_28->explen = (int)ctx_00 + 1;
      if (0xfff < local_28->explen) {
        errsigf(ctx_00,in_stack_ffffffffffffffc8,0);
      }
    }
    else if (*in_RSI == 0x5f5f454e494c5f5f) {
      facility = (char *)(**(code **)(*(long *)(in_RDI + 0x18) + 0xa0))
                                   (*(undefined8 *)(in_RDI + 0x18));
      sprintf(local_28->expan,"%lu",facility);
      sVar2 = strlen(local_28->expan);
      local_28->explen = (int)sVar2;
      if (0x27 < local_28->explen) {
        errsigf(in_stack_ffffffffffffffd0,facility,0);
      }
    }
  }
  return local_28;
}

Assistant:

static tokdfdef *tok_find_define(tokcxdef *ctx, char *sym, int len)
{
    int       hsh;
    tokdfdef *df;

    /* find the appropriate chain the hash table */
    hsh = tokdfhsh(sym, len);

    /* search the chain for this symbol */
    for (df = ctx->tokcxdf[hsh] ; df ; df = df->nxt)
    {
        /* if this one matches, return it */
        if (df->len == len && !memcmp(df->nm, sym, (size_t)len))
        {
            /* fix it up if it's the special __FILE__ or __LINE__ symbol */
            if (len == 8)
            {
                if (!memcmp(sym, "__FILE__", (size_t)8))
                {
                    size_t len;

                    /* 
                     *   put in the opening single quote, since we want
                     *   the expanded result to be a string 
                     */
                    df->expan[0] = '\'';

                    /* get the name */
                    linnam(ctx->tokcxlin, df->expan+1);

                    /* get the length, and add the closing quote */
                    len = strlen(df->expan);
                    df->expan[len] = '\'';

                    /* 
                     *   set the length of the expansion, including the
                     *   quotes (the first quote was measured in the
                     *   length originally, but the second quote hasn't
                     *   been counted yet, so add one to our original
                     *   length) 
                     */
                    df->explen = (int)len + 1;

                    /* if the expansion is too long, it's an error */
                    if (df->explen >= OSFNMAX)
                        errsig(ctx->tokcxerr, ERR_LONG_FILE_MACRO);
                }
                else if (!memcmp(sym, "__LINE__", (size_t)8))
                {
                    ulong l;

                    /* get the line number */
                    l = linlnum(ctx->tokcxlin);

                    /* convert it to a textual format for the expansion */
                    sprintf(df->expan, "%lu", l);

                    /* set the expanded value's length */
                    df->explen = strlen(df->expan);

                    /* make sure the expansion isn't too long */
                    if (df->explen >= 40)
                        errsig(ctx->tokcxerr, ERR_LONG_LINE_MACRO);
                }
            }
            
            /* return it */
            return df;
        }
    }

    /* didn't find anything */
    return 0;
}